

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::FillCheckPad
          (Recycler *this,void *address,size_t size,size_t alignedAllocSize,
          bool objectAlreadyInitialized)

{
  BOOL BVar1;
  IRecyclerVisitedObject local_48;
  DummyVTableObject dummy;
  size_t sizeToVerify;
  void *addressToVerify;
  bool objectAlreadyInitialized_local;
  size_t alignedAllocSize_local;
  size_t size_local;
  void *address_local;
  Recycler *this_local;
  
  BVar1 = VerifyEnabled(this);
  if (BVar1 != 0) {
    if (objectAlreadyInitialized) {
      sizeToVerify = (long)address + size;
      dummy.super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           (FinalizableObject)(alignedAllocSize - size);
    }
    else {
      dummy.super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           (FinalizableObject)(FinalizableObject)alignedAllocSize;
      DummyVTableObject::DummyVTableObject((DummyVTableObject *)&local_48);
      sizeToVerify = (size_t)address;
      if (local_48._vptr_IRecyclerVisitedObject == *address) {
        sizeToVerify = (long)address + 8;
        dummy.super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
             (FinalizableObject)(alignedAllocSize - 8);
      }
    }
    VerifyCheckFill((void *)sizeToVerify,
                    (long)dummy.super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject - 8);
    FillPadNoCheck(address,size,alignedAllocSize,objectAlreadyInitialized);
  }
  return;
}

Assistant:

void
Recycler::FillCheckPad(void * address, size_t size, size_t alignedAllocSize, bool objectAlreadyInitialized)
{
    if (this->VerifyEnabled())
    {
        void* addressToVerify = address;
        size_t sizeToVerify = alignedAllocSize;

        if (objectAlreadyInitialized)
        {
            addressToVerify = ((char*) address + size);
            sizeToVerify = (alignedAllocSize - size);
        }
        else
        {
            // It could be the case that an uninitialized object already has a dummy vtable installed
            // at the beginning of the address. If that is the case, we can't verify the fill pattern
            // on that memory, since it's already been initialized.
            // Note that FillPadNoCheck will skip over the first sizeof(FreeObject) bytes, which
            // prevents overwriting of the vtable.
            static_assert(sizeof(DummyVTableObject) == sizeof(void*), "Incorrect size for a DummyVTableObject - it must contain a single v-table pointer");
            DummyVTableObject dummy;
            if ((*(void**)(&dummy)) == *((void**)address))
            {
                addressToVerify = (char*)address + sizeof(DummyVTableObject);
                sizeToVerify = alignedAllocSize - sizeof(DummyVTableObject);
            }
        }

        // Actually this is filling the non-pad to zero
        VerifyCheckFill(addressToVerify, sizeToVerify - sizeof(size_t));

        FillPadNoCheck(address, size, alignedAllocSize, objectAlreadyInitialized);
    }
}